

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcBlendEquationAdvancedTests.cpp
# Opt level: O0

char * glcts::GetLayoutQualifierStr(GLenum mode)

{
  char *pcStack_10;
  GLenum mode_local;
  
  switch(mode) {
  case 0x9294:
    pcStack_10 = "blend_support_multiply";
    break;
  case 0x9295:
    pcStack_10 = "blend_support_screen";
    break;
  case 0x9296:
    pcStack_10 = "blend_support_overlay";
    break;
  case 0x9297:
    pcStack_10 = "blend_support_darken";
    break;
  case 0x9298:
    pcStack_10 = "blend_support_lighten";
    break;
  case 0x9299:
    pcStack_10 = "blend_support_colordodge";
    break;
  case 0x929a:
    pcStack_10 = "blend_support_colorburn";
    break;
  case 0x929b:
    pcStack_10 = "blend_support_hardlight";
    break;
  case 0x929c:
    pcStack_10 = "blend_support_softlight";
    break;
  default:
    pcStack_10 = "Blend mode not from GL_KHR_blend_equation_advanced.";
    break;
  case 0x929e:
    pcStack_10 = "blend_support_difference";
    break;
  case 0x92a0:
    pcStack_10 = "blend_support_exclusion";
    break;
  case 0x92ad:
    pcStack_10 = "blend_support_hsl_hue";
    break;
  case 0x92ae:
    pcStack_10 = "blend_support_hsl_saturation";
    break;
  case 0x92af:
    pcStack_10 = "blend_support_hsl_color";
    break;
  case 0x92b0:
    pcStack_10 = "blend_support_hsl_luminosity";
  }
  return pcStack_10;
}

Assistant:

static const char* GetLayoutQualifierStr(glw::GLenum mode)
{
	switch (mode)
	{
	case GL_MULTIPLY_KHR:
		return "blend_support_multiply";
	case GL_SCREEN_KHR:
		return "blend_support_screen";
	case GL_OVERLAY_KHR:
		return "blend_support_overlay";
	case GL_DARKEN_KHR:
		return "blend_support_darken";
	case GL_LIGHTEN_KHR:
		return "blend_support_lighten";
	case GL_COLORDODGE_KHR:
		return "blend_support_colordodge";
	case GL_COLORBURN_KHR:
		return "blend_support_colorburn";
	case GL_HARDLIGHT_KHR:
		return "blend_support_hardlight";
	case GL_SOFTLIGHT_KHR:
		return "blend_support_softlight";
	case GL_DIFFERENCE_KHR:
		return "blend_support_difference";
	case GL_EXCLUSION_KHR:
		return "blend_support_exclusion";
	case GL_HSL_HUE_KHR:
		return "blend_support_hsl_hue";
	case GL_HSL_SATURATION_KHR:
		return "blend_support_hsl_saturation";
	case GL_HSL_COLOR_KHR:
		return "blend_support_hsl_color";
	case GL_HSL_LUMINOSITY_KHR:
		return "blend_support_hsl_luminosity";
	default:
		DE_ASSERT(DE_FALSE && "Blend mode not from GL_KHR_blend_equation_advanced.");
		return "Blend mode not from GL_KHR_blend_equation_advanced.";
	}
}